

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O2

bool __thiscall QTreeModel::clearItemData(QTreeModel *this,QModelIndex *index)

{
  QWidgetItemData *pQVar1;
  int iVar2;
  QList<QWidgetItemData> *pQVar3;
  char cVar4;
  bool bVar5;
  QTreeWidgetItem *pQVar6;
  long lVar7;
  pointer pQVar8;
  pointer pQVar9;
  long lVar10;
  QWidgetItemData *pQVar11;
  QTreeModel *this_00;
  QWidgetItemData *pQVar12;
  QTreeWidgetItemPrivate *pQVar13;
  long in_FS_OFFSET;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this;
  cVar4 = QAbstractItemModel::checkIndex(this,index,1);
  if ((cVar4 == '\0') || (pQVar6 = item(this_00,index), pQVar6 == (QTreeWidgetItem *)0x0)) {
    bVar5 = false;
    goto LAB_0054d2e7;
  }
  iVar2 = index->c;
  pQVar3 = (pQVar6->values).d.ptr;
  pQVar12 = pQVar3[iVar2].d.ptr;
  lVar10 = pQVar3[iVar2].d.size;
  lVar7 = lVar10 * 0x28;
  pQVar1 = pQVar12 + lVar10;
  pQVar12 = pQVar12 + 2;
  for (lVar10 = lVar10 >> 2; 0 < lVar10; lVar10 = lVar10 + -1) {
    if (3 < *(ulong *)&pQVar12[-2].value.d.field_0x18) {
      pQVar11 = pQVar12 + -2;
      goto LAB_0054d245;
    }
    if (3 < *(ulong *)&pQVar12[-1].value.d.field_0x18) {
      pQVar11 = pQVar12 + -1;
      goto LAB_0054d245;
    }
    pQVar11 = pQVar12;
    if (3 < *(ulong *)&(pQVar12->value).d.field_0x18) goto LAB_0054d245;
    if (3 < *(ulong *)&pQVar12[1].value.d.field_0x18) {
      pQVar11 = pQVar12 + 1;
      goto LAB_0054d245;
    }
    pQVar12 = pQVar12 + 4;
    lVar7 = lVar7 + -0xa0;
  }
  lVar7 = lVar7 / 0x28;
  pQVar11 = pQVar12 + -2;
  if (lVar7 == 1) {
LAB_0054d326:
    if (*(ulong *)&(pQVar11->value).d.field_0x18 < 4) {
      pQVar11 = pQVar1;
    }
LAB_0054d245:
    if (pQVar11 == pQVar1) goto LAB_0054d250;
    pQVar13 = pQVar6->d;
  }
  else {
    if (lVar7 == 3) {
      if (*(ulong *)&pQVar12[-2].value.d.field_0x18 < 4) {
        pQVar11 = pQVar12 + -1;
        goto LAB_0054d317;
      }
      goto LAB_0054d245;
    }
    if (lVar7 == 2) {
LAB_0054d317:
      if (*(ulong *)&(pQVar11->value).d.field_0x18 < 4) {
        pQVar11 = pQVar11 + 1;
        goto LAB_0054d326;
      }
      goto LAB_0054d245;
    }
LAB_0054d250:
    pQVar13 = pQVar6->d;
    bVar5 = true;
    if (*(ulong *)&(pQVar13->display).d.ptr[iVar2].d.field_0x18 < 4) goto LAB_0054d2e7;
  }
  local_58._16_8_ = 0;
  local_58.shared = (PrivateShared *)0x0;
  local_58._8_8_ = 0;
  local_40 = 2;
  pQVar8 = QList<QVariant>::data(&pQVar13->display);
  ::QVariant::operator=(pQVar8 + iVar2,(QVariant *)&local_58);
  ::QVariant::~QVariant((QVariant *)&local_58);
  iVar2 = index->c;
  pQVar9 = QList<QList<QWidgetItemData>_>::data(&pQVar6->values);
  QList<QWidgetItemData>::clear(pQVar9 + iVar2);
  local_58.shared = (PrivateShared *)0x0;
  local_58._8_8_ = 0;
  local_58._16_8_ = 0;
  QAbstractItemModel::dataChanged((QModelIndex *)this,index,(QList_conflict *)index);
  QArrayDataPointer<int>::~QArrayDataPointer((QArrayDataPointer<int> *)&local_58);
  bVar5 = true;
LAB_0054d2e7:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return bVar5;
}

Assistant:

bool QTreeModel::clearItemData(const QModelIndex &index)
{
    if (!checkIndex(index, CheckIndexOption::IndexIsValid))
        return false;
    QTreeWidgetItem *itm = item(index);
    if (!itm)
        return false;
    const auto beginIter = itm->values.at(index.column()).cbegin();
    const auto endIter = itm->values.at(index.column()).cend();
    if (std::all_of(beginIter, endIter, [](const QWidgetItemData& data) -> bool { return !data.value.isValid(); })
        && !itm->d->display.at(index.column()).isValid()) {
        return true; //it's already cleared
    }
    itm->d->display[index.column()] = QVariant();
    itm->values[index.column()].clear();
    emit dataChanged(index, index, QList<int> {});
    return true;
}